

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseTemplate
          (Parser *this,string *text,initializer_list<AssemblyTemplateArgument> variables)

{
  const_iterator pAVar1;
  size_t count;
  AssemblyTemplateArgument *arg;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<AssemblyTemplateArgument> *__range1;
  string fullText;
  string *text_local;
  Parser *this_local;
  initializer_list<AssemblyTemplateArgument> variables_local;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *result;
  
  this_local = (Parser *)variables._M_len;
  fullText.field_2._8_8_ = variables._M_array;
  variables_local._M_len = (size_type)this;
  std::__cxx11::string::string((string *)&__range1,(string *)fullText.field_2._8_8_);
  *(undefined1 *)&text[4]._M_string_length = 1;
  *(int *)((long)&text[4]._M_string_length + 4) = Global.FileInfo.FileNum;
  *(int *)&text[4].field_2 = Global.FileInfo.LineNumber;
  __end1 = std::initializer_list<AssemblyTemplateArgument>::begin
                     ((initializer_list<AssemblyTemplateArgument> *)&this_local);
  pAVar1 = std::initializer_list<AssemblyTemplateArgument>::end
                     ((initializer_list<AssemblyTemplateArgument> *)&this_local);
  for (; __end1 != pAVar1; __end1 = __end1 + 1) {
    replaceAll((string *)&__range1,__end1->variableName,&__end1->value);
  }
  parseString(this,text);
  *(undefined1 *)&text[4]._M_string_length = 0;
  std::__cxx11::string::~string((string *)&__range1);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseTemplate(const std::string& text, std::initializer_list<AssemblyTemplateArgument> variables)
{
	std::string fullText = text;

	overrideFileInfo = true;
	overrideFileNum = Global.FileInfo.FileNum;
	overrideLineNum = Global.FileInfo.LineNumber;

	for (auto& arg: variables)
	{
		size_t count = replaceAll(fullText,arg.variableName,arg.value);
		(void)count;
#ifdef _DEBUG
		if (count != 0 && arg.value.empty())
			Logger::printError(Logger::Warning, "Empty replacement for %s",arg.variableName);
#endif
	}

	std::unique_ptr<CAssemblerCommand> result = parseString(fullText);
	overrideFileInfo = false;

	return result;
}